

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar3 -
                  (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x50)) {
    lineInfo.file = (char *)((ulong)lineInfo.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
      printHeaderString(this,&pSVar3->name,2);
    }
    Colour::~Colour((Colour *)&lineInfo);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lineInfo.file = pSVar3[-1].lineInfo.file;
  lineInfo.line = pSVar3[-1].lineInfo.line;
  if (*lineInfo.file != '\0') {
    if (getLineOfChars<(char)45>()::line == '\0') {
      uRam000000000019cd70 = 0x2d2d2d2d2d2d2d;
      uRam000000000019cd77._0_1_ = '-';
      uRam000000000019cd77._1_1_ = '-';
      uRam000000000019cd77._2_1_ = '-';
      uRam000000000019cd77._3_1_ = '-';
      uRam000000000019cd77._4_1_ = '-';
      uRam000000000019cd77._5_1_ = '-';
      uRam000000000019cd77._6_1_ = '-';
      uRam000000000019cd77._7_1_ = '-';
      DAT_0019cd60 = '-';
      DAT_0019cd60_1._0_1_ = '-';
      DAT_0019cd60_1._1_1_ = '-';
      DAT_0019cd60_1._2_1_ = '-';
      DAT_0019cd60_1._3_1_ = '-';
      DAT_0019cd60_1._4_1_ = '-';
      DAT_0019cd60_1._5_1_ = '-';
      DAT_0019cd60_1._6_1_ = '-';
      uRam000000000019cd68 = 0x2d2d2d2d2d2d2d;
      DAT_0019cd6f = 0x2d;
      DAT_0019cd50 = '-';
      DAT_0019cd50_1._0_1_ = '-';
      DAT_0019cd50_1._1_1_ = '-';
      DAT_0019cd50_1._2_1_ = '-';
      DAT_0019cd50_1._3_1_ = '-';
      DAT_0019cd50_1._4_1_ = '-';
      DAT_0019cd50_1._5_1_ = '-';
      DAT_0019cd50_1._6_1_ = '-';
      uRam000000000019cd58._0_1_ = '-';
      uRam000000000019cd58._1_1_ = '-';
      uRam000000000019cd58._2_1_ = '-';
      uRam000000000019cd58._3_1_ = '-';
      uRam000000000019cd58._4_1_ = '-';
      uRam000000000019cd58._5_1_ = '-';
      uRam000000000019cd58._6_1_ = '-';
      uRam000000000019cd58._7_1_ = '-';
      DAT_0019cd40 = '-';
      DAT_0019cd40_1._0_1_ = '-';
      DAT_0019cd40_1._1_1_ = '-';
      DAT_0019cd40_1._2_1_ = '-';
      DAT_0019cd40_1._3_1_ = '-';
      DAT_0019cd40_1._4_1_ = '-';
      DAT_0019cd40_1._5_1_ = '-';
      DAT_0019cd40_1._6_1_ = '-';
      uRam000000000019cd48._0_1_ = '-';
      uRam000000000019cd48._1_1_ = '-';
      uRam000000000019cd48._2_1_ = '-';
      uRam000000000019cd48._3_1_ = '-';
      uRam000000000019cd48._4_1_ = '-';
      uRam000000000019cd48._5_1_ = '-';
      uRam000000000019cd48._6_1_ = '-';
      uRam000000000019cd48._7_1_ = '-';
      getLineOfChars<(char)45>()::line = '-';
      getLineOfChars<(char)45>()::line_1._0_1_ = '-';
      getLineOfChars<(char)45>()::line_1._1_1_ = '-';
      getLineOfChars<(char)45>()::line_1._2_1_ = '-';
      getLineOfChars<(char)45>()::line_1._3_1_ = '-';
      getLineOfChars<(char)45>()::line_1._4_1_ = '-';
      getLineOfChars<(char)45>()::line_1._5_1_ = '-';
      getLineOfChars<(char)45>()::line_1._6_1_ = '-';
      uRam000000000019cd38._0_1_ = '-';
      uRam000000000019cd38._1_1_ = '-';
      uRam000000000019cd38._2_1_ = '-';
      uRam000000000019cd38._3_1_ = '-';
      uRam000000000019cd38._4_1_ = '-';
      uRam000000000019cd38._5_1_ = '-';
      uRam000000000019cd38._6_1_ = '-';
      uRam000000000019cd38._7_1_ = '-';
      DAT_0019cd7f = 0;
    }
    poVar2 = std::operator<<((ostream *)
                             (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             &getLineOfChars<(char)45>()::line);
    std::operator<<(poVar2,'\n');
    colourGuard_1.m_moved = false;
    Colour::use(FileName);
    os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Catch::operator<<(os,&lineInfo);
    std::operator<<((ostream *)os,'\n');
    Colour::~Colour(&colourGuard_1);
  }
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000019ce10 = 0x2e2e2e2e2e2e2e;
    uRam000000000019ce17._0_1_ = '.';
    uRam000000000019ce17._1_1_ = '.';
    uRam000000000019ce17._2_1_ = '.';
    uRam000000000019ce17._3_1_ = '.';
    uRam000000000019ce17._4_1_ = '.';
    uRam000000000019ce17._5_1_ = '.';
    uRam000000000019ce17._6_1_ = '.';
    uRam000000000019ce17._7_1_ = '.';
    DAT_0019ce00 = '.';
    DAT_0019ce00_1._0_1_ = '.';
    DAT_0019ce00_1._1_1_ = '.';
    DAT_0019ce00_1._2_1_ = '.';
    DAT_0019ce00_1._3_1_ = '.';
    DAT_0019ce00_1._4_1_ = '.';
    DAT_0019ce00_1._5_1_ = '.';
    DAT_0019ce00_1._6_1_ = '.';
    uRam000000000019ce08 = 0x2e2e2e2e2e2e2e;
    DAT_0019ce0f = 0x2e;
    DAT_0019cdf0 = '.';
    DAT_0019cdf0_1._0_1_ = '.';
    DAT_0019cdf0_1._1_1_ = '.';
    DAT_0019cdf0_1._2_1_ = '.';
    DAT_0019cdf0_1._3_1_ = '.';
    DAT_0019cdf0_1._4_1_ = '.';
    DAT_0019cdf0_1._5_1_ = '.';
    DAT_0019cdf0_1._6_1_ = '.';
    uRam000000000019cdf8._0_1_ = '.';
    uRam000000000019cdf8._1_1_ = '.';
    uRam000000000019cdf8._2_1_ = '.';
    uRam000000000019cdf8._3_1_ = '.';
    uRam000000000019cdf8._4_1_ = '.';
    uRam000000000019cdf8._5_1_ = '.';
    uRam000000000019cdf8._6_1_ = '.';
    uRam000000000019cdf8._7_1_ = '.';
    DAT_0019cde0 = '.';
    DAT_0019cde0_1._0_1_ = '.';
    DAT_0019cde0_1._1_1_ = '.';
    DAT_0019cde0_1._2_1_ = '.';
    DAT_0019cde0_1._3_1_ = '.';
    DAT_0019cde0_1._4_1_ = '.';
    DAT_0019cde0_1._5_1_ = '.';
    DAT_0019cde0_1._6_1_ = '.';
    uRam000000000019cde8._0_1_ = '.';
    uRam000000000019cde8._1_1_ = '.';
    uRam000000000019cde8._2_1_ = '.';
    uRam000000000019cde8._3_1_ = '.';
    uRam000000000019cde8._4_1_ = '.';
    uRam000000000019cde8._5_1_ = '.';
    uRam000000000019cde8._6_1_ = '.';
    uRam000000000019cde8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000019cdd8._0_1_ = '.';
    uRam000000000019cdd8._1_1_ = '.';
    uRam000000000019cdd8._2_1_ = '.';
    uRam000000000019cdd8._3_1_ = '.';
    uRam000000000019cdd8._4_1_ = '.';
    uRam000000000019cdd8._5_1_ = '.';
    uRam000000000019cdd8._6_1_ = '.';
    uRam000000000019cdd8._7_1_ = '.';
    DAT_0019ce1f = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  poVar2 = std::operator<<(poVar2,'\n');
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    if (!lineInfo.empty()) {
        stream << getLineOfChars<'-'>() << '\n';
        Colour colourGuard(Colour::FileName);
        stream << lineInfo << '\n';
    }
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}